

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O3

Validity * __thiscall
kj::TestRunner::setBenchmarkIters(Validity *__return_storage_ptr__,TestRunner *this,StringPtr param)

{
  bool bVar1;
  String local_38;
  char *local_20;
  size_t local_18;
  
  local_18 = param.content.size_;
  local_20 = param.content.ptr;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_38);
  bVar1 = (char)local_38.content.ptr != '\x01';
  if (bVar1) {
    heapString(&local_38,"expected an integer",0x13);
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
         (char *)CONCAT71(local_38.content.ptr._1_7_,(char)local_38.content.ptr);
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = local_38.content.size_;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
         local_38.content.disposer;
  }
  else {
    (anonymous_namespace)::benchmarkIterCount = local_38.content.size_;
  }
  (__return_storage_ptr__->errorMessage).ptr.isSet = bVar1;
  return __return_storage_ptr__;
}

Assistant:

MainBuilder::Validity setBenchmarkIters(StringPtr param) {
    KJ_IF_SOME(i, param.tryParseAs<size_t>()) {
      benchmarkIterCount = i;
      return true;
    } else {
      return "expected an integer";
    }